

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flip_book_group.cpp
# Opt level: O1

void flip_book_copy(Am_Object *self)

{
  Am_Value_List *this;
  ulong uVar1;
  ulong *puVar2;
  bool bVar3;
  unsigned_short uVar4;
  Am_Object_Demon *pAVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  long lVar8;
  Am_Object *pAVar9;
  Am_Object current_component;
  Am_Value_List components;
  Am_Object part;
  Am_Part_Iterator parts;
  Am_Value_List new_components;
  Am_Object in_stack_ffffffffffffff58;
  undefined1 local_a0 [24];
  Am_Object local_88;
  Am_Object local_80;
  Am_Part_Iterator local_78;
  ulong *local_68;
  Am_Object local_60;
  Am_Value_List local_58;
  Am_Object *local_48;
  ulong *local_40;
  Am_Object *local_38;
  
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)(local_a0 + 8));
  pAVar5 = Am_Demon_Set::Get_Object_Demon((Am_Demon_Set *)(local_a0 + 8),Am_COPY_OBJ);
  Am_Demon_Set::~Am_Demon_Set((Am_Demon_Set *)(local_a0 + 8));
  Am_Object::Am_Object(&local_60,self);
  (*pAVar5)(in_stack_ffffffffffffff58);
  Am_Object::~Am_Object(&local_60);
  Am_Value_List::Am_Value_List((Am_Value_List *)(local_a0 + 8));
  pAVar6 = Am_Object::Get(self,0x83,0);
  Am_Value_List::operator=((Am_Value_List *)(local_a0 + 8),pAVar6);
  Am_Value_List::Am_Value_List(&local_58);
  Am_Object::Am_Object(&local_80,self);
  Am_Part_Iterator::Am_Part_Iterator(&local_78,&local_80);
  Am_Object::~Am_Object(&local_80);
  uVar4 = Am_Part_Iterator::Length(&local_78);
  bVar3 = Am_Value_List::Empty((Am_Value_List *)(local_a0 + 8));
  if (uVar4 == 0 || bVar3) {
    pAVar7 = Am_Value_List::operator_cast_to_Am_Wrapper_(&Am_No_Value_List);
    Am_Object::Set(self,0x83,pAVar7,0);
  }
  else {
    local_48 = self;
    local_68 = (ulong *)operator_new__((ulong)uVar4 * 0x10 + 8);
    *local_68 = (ulong)((uint)uVar4 + (uint)uVar4);
    pAVar9 = (Am_Object *)(local_68 + 1);
    memset(pAVar9,0,(ulong)uVar4 * 0x10);
    local_88.data = (Am_Object_Data *)0x0;
    Am_Part_Iterator::Start(&local_78);
    uVar1 = (ulong)uVar4;
    local_38 = pAVar9;
    while (bVar3 = Am_Part_Iterator::Last(&local_78), !bVar3) {
      Am_Part_Iterator::Get((Am_Part_Iterator *)local_a0);
      Am_Object::operator=(&local_88,(Am_Object *)local_a0);
      Am_Object::~Am_Object((Am_Object *)local_a0);
      Am_Object::operator=(pAVar9 + uVar1,&local_88);
      pAVar6 = Am_Object::Get(&local_88,0xc,0);
      Am_Object::operator=(pAVar9,pAVar6);
      pAVar9 = pAVar9 + 1;
      Am_Part_Iterator::Next(&local_78);
    }
    local_a0._0_8_ = (Am_Object_Data *)0x0;
    Am_Value_List::Start((Am_Value_List *)(local_a0 + 8));
    local_40 = local_68 + uVar1;
    this = (Am_Value_List *)(local_a0 + 8);
    while (bVar3 = Am_Value_List::Last(this), puVar2 = local_68, !bVar3) {
      pAVar6 = Am_Value_List::Get(this);
      Am_Object::operator=((Am_Object *)local_a0,pAVar6);
      if (uVar4 != 0) {
        lVar8 = -8;
        pAVar9 = local_38;
        do {
          bVar3 = Am_Object::operator==((Am_Object *)local_a0,pAVar9);
          if (bVar3) {
            pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)((long)local_40 - lVar8));
            Am_Value_List::Add(&local_58,pAVar7,Am_TAIL,true);
            break;
          }
          lVar8 = lVar8 + -8;
          pAVar9 = pAVar9 + 1;
        } while (uVar1 * 8 + 8 + lVar8 != 0);
      }
      Am_Value_List::Next(this);
    }
    if (*local_68 != 0) {
      lVar8 = *local_68 << 3;
      do {
        Am_Object::~Am_Object((Am_Object *)((long)puVar2 + lVar8));
        lVar8 = lVar8 + -8;
      } while (lVar8 != 0);
    }
    operator_delete__(puVar2);
    pAVar7 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_58);
    Am_Object::Set(local_48,0x83,pAVar7,0);
    Am_Object::~Am_Object((Am_Object *)local_a0);
    Am_Object::~Am_Object(&local_88);
  }
  Am_Object::~Am_Object(&local_78.owner);
  Am_Object::~Am_Object(&local_78.current);
  Am_Value_List::~Am_Value_List(&local_58);
  Am_Value_List::~Am_Value_List((Am_Value_List *)(local_a0 + 8));
  return;
}

Assistant:

static void
flip_book_copy(Am_Object self)
{
  Am_Object_Demon *copy_demon = ((Am_Object_Advanced &)Am_Aggregate)
                                    .Get_Demons()
                                    .Get_Object_Demon(Am_COPY_OBJ);
  copy_demon(self);

  Am_Value_List components;
  components = self.Get(Am_FLIP_BOOK_PARTS);
  Am_Value_List new_components;
  Am_Part_Iterator parts = self;
  int parts_length = parts.Length();
  if (components.Empty() || (parts_length == 0)) {
    self.Set(Am_FLIP_BOOK_PARTS, Am_No_Value_List);
    return;
  }
  Am_Object *part_map = new Am_Object[parts_length * 2];
  Am_Object part;
  int i;
  for (i = 0, parts.Start(); !parts.Last(); ++i, parts.Next()) {
    part = parts.Get();
    part_map[i + parts_length] = part;
    part_map[i] = part.Get(Am_SOURCE_OF_COPY);
  }
  Am_Object current_component;
  for (components.Start(); !components.Last(); components.Next()) {
    current_component = components.Get();
    for (i = 0; i < parts_length; ++i)
      if (current_component == part_map[i]) {
        new_components.Add(part_map[i + parts_length]);
        break;
      }
  }
  delete[] part_map;
  self.Set(Am_FLIP_BOOK_PARTS, new_components);
}